

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void google::protobuf::text_format_unittest::TextFormatExtensionsTest::SetUpTestSuite(void)

{
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  char *in_RCX;
  string_view path;
  Status *local_88;
  LogMessage local_70;
  Voidify local_5d [13];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_20 [16];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_20 + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"google/protobuf/testdata/text_format_unittest_extensions_data.txt");
  path._M_str = in_RCX;
  path._M_len = (size_t)local_50._M_str;
  TestUtil::GetTestDataPath_abi_cxx11_(&local_40,(TestUtil *)local_50._M_len,path);
  File::GetContents((string *)local_20,&local_40,true);
  local_20._8_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_20);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_20._8_8_);
  if (bVar1) {
    local_88 = (Status *)0x0;
  }
  else {
    local_88 = (Status *)
               absl::lts_20250127::status_internal::MakeCheckFailString
                         ((Nonnull<const_absl::Status_*>)local_20._8_8_,
                          "File::GetContents( TestUtil::GetTestDataPath(\"google/protobuf/testdata/\" \"text_format_unittest_extensions_data.txt\"), &static_proto_text_format_, true) is OK"
                         );
  }
  absl_log_internal_check_ok_goo.first = local_88;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_20._8_8_);
  absl::lts_20250127::Status::~Status((Status *)local_20);
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
             ,0x8e,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_5d,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
}

Assistant:

static void SetUpTestSuite() {
    ABSL_CHECK_OK(File::GetContents(
        TestUtil::GetTestDataPath("google/protobuf/testdata/"
                                  "text_format_unittest_extensions_data.txt"),
        &static_proto_text_format_, true));
  }